

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
TimeConversionsPrecise_Correctness_Test::TestBody(TimeConversionsPrecise_Correctness_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_5;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  double one_day_in_sec;
  double one_week_in_day;
  double one_day_in_hour;
  double one_hour_in_min;
  double one_min_in_sec;
  TimeConversionsPrecise_Correctness_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40f5180000000000;
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    ((precise_unit *)units::precise::time::minute,(precise_unit *)units::precise::s)
  ;
  testing::internal::DoubleNearPredFormat
            ((internal *)local_48,"convert(minute, units::precise::s)","one_min_in_sec",
             "test::precise_tolerance",dVar3,60.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x1aa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    ((precise_unit *)units::precise::time::hr,
                     (precise_unit *)units::precise::time::minute);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_78,"convert(hr, minute)","one_hour_in_min","test::precise_tolerance",
             dVar3,60.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x1ab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    ((precise_unit *)units::precise::time::day,
                     (precise_unit *)units::precise::time::hr);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_98,"convert(day, hr)","one_day_in_hour","test::precise_tolerance",
             dVar3,24.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x1ac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    ((precise_unit *)units::precise::time::week,
                     (precise_unit *)units::precise::time::day);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b8,"convert(week, day)","one_week_in_day","test::precise_tolerance",
             dVar3,7.0,1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x1ad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    ((precise_unit *)units::precise::time::day,(precise_unit *)units::precise::s);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d8,"convert(day, units::precise::s)","one_day_in_sec",
             "test::precise_tolerance * one_day_in_sec",dVar3,
             (double)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,
             (double)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl * 1e-12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x1b1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    ((precise_unit *)units::precise::time::yr,
                     (precise_unit *)units::precise::time::day);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f8,"convert(yr, day)","365.0","test::precise_tolerance * 365.0",dVar3
             ,365.0,3.65e-10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x1b2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  return;
}

Assistant:

TEST(TimeConversionsPrecise, Correctness)
{
    using namespace units::precise::time;
    double one_min_in_sec = 60.0;
    double one_hour_in_min = 60.0;
    double one_day_in_hour = 24.0;
    double one_week_in_day = 7.0;
    double one_day_in_sec = 86400.0;

    EXPECT_NEAR(
        convert(minute, units::precise::s),
        one_min_in_sec,
        test::precise_tolerance);
    EXPECT_NEAR(convert(hr, minute), one_hour_in_min, test::precise_tolerance);
    EXPECT_NEAR(convert(day, hr), one_day_in_hour, test::precise_tolerance);
    EXPECT_NEAR(convert(week, day), one_week_in_day, test::precise_tolerance);
    EXPECT_NEAR(
        convert(day, units::precise::s),
        one_day_in_sec,
        test::precise_tolerance * one_day_in_sec);
    EXPECT_NEAR(convert(yr, day), 365.0, test::precise_tolerance * 365.0);
}